

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnproto_test::capnp::test::TestAllTypes::Builder&,char_const*>
          (String *__return_storage_ptr__,kj *this,Builder *params,char **params_1)

{
  kj *this_00;
  char **value;
  Builder *value_00;
  ArrayPtr<const_char> local_68;
  StringTree local_58;
  Builder *local_20;
  char **params_local_1;
  Builder *params_local;
  
  local_20 = params;
  params_local_1 = (char **)this;
  params_local = (Builder *)__return_storage_ptr__;
  this_00 = (kj *)fwd<capnproto_test::capnp::test::TestAllTypes::Builder&>((Builder *)this);
  toCharSequence<capnproto_test::capnp::test::TestAllTypes::Builder&>(&local_58,this_00,value_00);
  value = fwd<char_const*>((NoInfer<const_char_*> *)local_20);
  local_68 = toCharSequence<char_const*>(value);
  _::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_58,(StringTree *)&local_68,
             (ArrayPtr<const_char> *)local_68.ptr);
  StringTree::~StringTree(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}